

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::LayerNormalizationLayerParams::SharedCtor
          (LayerNormalizationLayerParams *this)

{
  LayerNormalizationLayerParams *this_local;
  
  memset(&this->gamma_,0,0x14);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void LayerNormalizationLayerParams::SharedCtor() {
  ::memset(&gamma_, 0, reinterpret_cast<char*>(&eps_) -
    reinterpret_cast<char*>(&gamma_) + sizeof(eps_));
  _cached_size_ = 0;
}